

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O0

void __thiscall PSBTOutput::Serialize<DataStream>(PSBTOutput *this,DataStream *s)

{
  bool bVar1;
  KeyOriginInfo *in_RSI;
  long in_FS_OFFSET;
  pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *entry_1;
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *__range2_2;
  type *origin;
  type *leaf_hashes;
  type *leaf;
  type *xonly;
  map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
  *__range2_1;
  type *script;
  type *leaf_ver;
  type *depth;
  vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *__range3;
  PSBTProprietary *entry;
  set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_> *__range2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  VectorWriter s_value_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  const_iterator __end3;
  const_iterator __begin3;
  VectorWriter s_value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  iterator __end2;
  iterator __begin2;
  pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>
  *in_stack_fffffffffffffe28;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *in_stack_fffffffffffffe30;
  DataStream *in_stack_fffffffffffffe38;
  KeyOriginInfo *in_stack_fffffffffffffe40;
  VectorWriter *in_stack_fffffffffffffe48;
  KeyOriginInfo *in_stack_fffffffffffffe68;
  map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
  *in_stack_fffffffffffffe88;
  DataStream *in_stack_fffffffffffffe90;
  CompactSizeWriter in_stack_fffffffffffffec8;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> local_c8;
  tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_98;
  undefined1 local_80 [48];
  _Base_ptr local_50;
  _Base_ptr local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffe28);
  if (!bVar1) {
    in_stack_fffffffffffffe68 = in_RSI;
    CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffe28,0x702f50);
    SerializeToVector<DataStream,CompactSizeWriter>
              ((DataStream *)in_stack_fffffffffffffe40,
               (CompactSizeWriter *)in_stack_fffffffffffffe38);
    DataStream::operator<<(in_stack_fffffffffffffe38,(CScript *)in_stack_fffffffffffffe30);
  }
  bVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffe28);
  if (!bVar1) {
    CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffe28,0x702fa5);
    SerializeToVector<DataStream,CompactSizeWriter>
              ((DataStream *)in_stack_fffffffffffffe40,
               (CompactSizeWriter *)in_stack_fffffffffffffe38);
    DataStream::operator<<(in_stack_fffffffffffffe38,(CScript *)in_stack_fffffffffffffe30);
  }
  CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffe28,0x702ffa);
  SerializeHDKeypaths<DataStream>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffec8);
  local_48 = (_Base_ptr)
             std::set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
             ::begin((set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
                      *)in_stack_fffffffffffffe30);
  local_50 = (_Base_ptr)
             std::set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
             ::end((set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
                    *)in_stack_fffffffffffffe30);
  while( true ) {
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffe38,(_Self *)in_stack_fffffffffffffe30);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::_Rb_tree_const_iterator<PSBTProprietary>::operator*
              ((_Rb_tree_const_iterator<PSBTProprietary> *)in_stack_fffffffffffffe28);
    DataStream::operator<<
              (in_stack_fffffffffffffe38,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30);
    DataStream::operator<<
              (in_stack_fffffffffffffe38,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30);
    std::_Rb_tree_const_iterator<PSBTProprietary>::operator++
              ((_Rb_tree_const_iterator<PSBTProprietary> *)in_stack_fffffffffffffe28);
  }
  bVar1 = XOnlyPubKey::IsNull(&in_stack_fffffffffffffe28->first);
  if (!bVar1) {
    SerializeToVector<DataStream,unsigned_char>
              ((DataStream *)in_stack_fffffffffffffe40,(uchar *)in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe48 = (VectorWriter *)(local_80 + 0x18);
    ToByteVector<XOnlyPubKey>((XOnlyPubKey *)in_stack_fffffffffffffe68);
    DataStream::operator<<
              (in_stack_fffffffffffffe38,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe40 = in_RSI;
  }
  bVar1 = std::
          vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::empty((vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)in_stack_fffffffffffffe38);
  if (!bVar1) {
    SerializeToVector<DataStream,unsigned_char>
              ((DataStream *)in_stack_fffffffffffffe40,(uchar *)in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe38 = (DataStream *)local_80;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe28);
    VectorWriter::VectorWriter
              (in_stack_fffffffffffffe48,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe40,
               (size_t)in_stack_fffffffffffffe38);
    local_98 = (tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)std::
                  vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::begin((vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)in_stack_fffffffffffffe30);
    local_c8._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::end((vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)in_stack_fffffffffffffe30);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                        ((__normal_iterator<const_std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                          *)in_stack_fffffffffffffe38,
                         (__normal_iterator<const_std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                          *)in_stack_fffffffffffffe30);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<const_std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ::operator*((__normal_iterator<const_std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                   *)in_stack_fffffffffffffe28);
      std::
      get<0ul,unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffe28);
      std::
      get<1ul,unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffe28);
      std::
      get<2ul,unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffe28);
      VectorWriter::operator<<
                ((VectorWriter *)in_stack_fffffffffffffe38,(uchar *)in_stack_fffffffffffffe30);
      VectorWriter::operator<<
                ((VectorWriter *)in_stack_fffffffffffffe38,(uchar *)in_stack_fffffffffffffe30);
      VectorWriter::operator<<
                ((VectorWriter *)in_stack_fffffffffffffe38,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30)
      ;
      __gnu_cxx::
      __normal_iterator<const_std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ::operator++((__normal_iterator<const_std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                    *)in_stack_fffffffffffffe28);
    }
    DataStream::operator<<
              (in_stack_fffffffffffffe38,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe38);
  }
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)
       std::
       map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
       ::begin((map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
                *)in_stack_fffffffffffffe30);
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)
       std::
       map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
       ::end((map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
              *)in_stack_fffffffffffffe30);
  while( true ) {
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffe38,(_Self *)in_stack_fffffffffffffe30);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
                 *)in_stack_fffffffffffffe28);
    std::
    get<0ul,XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>
              (in_stack_fffffffffffffe28);
    std::
    get<1ul,XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>
              (in_stack_fffffffffffffe28);
    std::get<0ul,std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>
              ((pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                *)in_stack_fffffffffffffe28);
    std::get<1ul,std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>
              ((pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                *)in_stack_fffffffffffffe28);
    SerializeToVector<DataStream,unsigned_char,XOnlyPubKey>
              ((DataStream *)in_stack_fffffffffffffe40,(uchar *)in_stack_fffffffffffffe38,
               (XOnlyPubKey *)in_stack_fffffffffffffe30);
    in_stack_fffffffffffffe30 = &local_c8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe28);
    VectorWriter::VectorWriter
              (in_stack_fffffffffffffe48,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe40,
               (size_t)in_stack_fffffffffffffe38);
    VectorWriter::operator<<((VectorWriter *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    KeyOriginInfo::KeyOriginInfo
              ((KeyOriginInfo *)in_stack_fffffffffffffe28,(KeyOriginInfo *)0x703439);
    SerializeKeyOrigin<VectorWriter>(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    KeyOriginInfo::~KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffffe28);
    DataStream::operator<<
              (in_stack_fffffffffffffe38,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe38);
    std::
    _Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
                  *)in_stack_fffffffffffffe28);
  }
  std::
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::begin((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)in_stack_fffffffffffffe30);
  std::
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::end((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)in_stack_fffffffffffffe30);
  while( true ) {
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffe38,(_Self *)in_stack_fffffffffffffe30);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_stack_fffffffffffffe28);
    DataStream::operator<<
              (in_stack_fffffffffffffe38,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30);
    DataStream::operator<<
              (in_stack_fffffffffffffe38,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffe28);
  }
  DataStream::operator<<(in_stack_fffffffffffffe38,(uchar *)in_stack_fffffffffffffe30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void Serialize(Stream& s) const {
        // Write the redeem script
        if (!redeem_script.empty()) {
            SerializeToVector(s, CompactSizeWriter(PSBT_OUT_REDEEMSCRIPT));
            s << redeem_script;
        }

        // Write the witness script
        if (!witness_script.empty()) {
            SerializeToVector(s, CompactSizeWriter(PSBT_OUT_WITNESSSCRIPT));
            s << witness_script;
        }

        // Write any hd keypaths
        SerializeHDKeypaths(s, hd_keypaths, CompactSizeWriter(PSBT_OUT_BIP32_DERIVATION));

        // Write proprietary things
        for (const auto& entry : m_proprietary) {
            s << entry.key;
            s << entry.value;
        }

        // Write taproot internal key
        if (!m_tap_internal_key.IsNull()) {
            SerializeToVector(s, PSBT_OUT_TAP_INTERNAL_KEY);
            s << ToByteVector(m_tap_internal_key);
        }

        // Write taproot tree
        if (!m_tap_tree.empty()) {
            SerializeToVector(s, PSBT_OUT_TAP_TREE);
            std::vector<unsigned char> value;
            VectorWriter s_value{value, 0};
            for (const auto& [depth, leaf_ver, script] : m_tap_tree) {
                s_value << depth;
                s_value << leaf_ver;
                s_value << script;
            }
            s << value;
        }

        // Write taproot bip32 keypaths
        for (const auto& [xonly, leaf] : m_tap_bip32_paths) {
            const auto& [leaf_hashes, origin] = leaf;
            SerializeToVector(s, PSBT_OUT_TAP_BIP32_DERIVATION, xonly);
            std::vector<unsigned char> value;
            VectorWriter s_value{value, 0};
            s_value << leaf_hashes;
            SerializeKeyOrigin(s_value, origin);
            s << value;
        }

        // Write unknown things
        for (auto& entry : unknown) {
            s << entry.first;
            s << entry.second;
        }

        s << PSBT_SEPARATOR;
    }